

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::ld_hl_sp_d8(SM83 *this)

{
  uint uVar1;
  u16 addr;
  ushort uVar2;
  byte bVar3;
  string_view fmt;
  format_args args;
  ulong local_88 [2];
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  
  addr = this->pc;
  this->pc = addr + 1;
  bVar3 = Bus::Read8(this->bus,addr,true);
  local_88[0] = (ulong)(this->field_0).af;
  local_78 = (ulong)(this->field_1).bc;
  local_68 = (ulong)(this->field_2).de;
  local_58 = (ulong)(this->field_3).hl;
  local_48 = (ulong)this->sp;
  local_38 = (ulong)this->pc_at_opcode;
  local_28 = (long)(char)bVar3 & 0xffffffff;
  fmt.size_ = 0x50;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD HL, SP+0x{:02X}\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_88;
  args.desc_ = 0x1222222;
  ::fmt::v11::vprint(fmt,args);
  uVar2 = this->sp;
  uVar1 = (uint)uVar2 + (int)(char)bVar3;
  (this->field_0).field_1.f =
       (byte)(((int)(char)bVar3 ^ (uint)uVar2 ^ uVar1) >> 4) & 0x10 |
       (bVar3 ^ (byte)uVar2 ^ (byte)uVar1) * '\x02' & 0x20 | (this->field_0).field_1.f & 0xf;
  (this->field_3).hl = (u16)uVar1;
  Timer::AdvanceCycles(this->timer,4);
  return;
}

Assistant:

void SM83::ld_hl_sp_d8() {
    s8 value = static_cast<s8>(GetByteFromPC());
    LTRACE("LD HL, SP+0x{:02X}", value);

    u32 result = sp + value;

    SetZeroFlag(false);
    SetNegateFlag(false);
    SetHalfCarryFlag(((sp ^ value ^ (result & 0xFFFF)) & 0x10) == 0x10);
    SetCarryFlag(((sp ^ value ^ (result & 0xFFFF)) & 0x100) == 0x100);

    hl = static_cast<u16>(result);

    timer.AdvanceCycles(4);
}